

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35efd::TestTestsAreAddedToTheListThroughMacro::RunImpl
          (TestTestsAreAddedToTheListThroughMacro *this)

{
  TestResults *pTVar1;
  Test *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails TStack_28;
  
  pTVar2 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::list1);
  if (pTVar2 == (Test *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_28,*ppTVar4,0x15);
    UnitTest::TestResults::OnTestFailure(pTVar1,&TStack_28,"list1.GetHead() != 0");
  }
  pTVar2 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::list1);
  if (pTVar2->next != (Test *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_28,*ppTVar4,0x16);
    UnitTest::TestResults::OnTestFailure(pTVar1,&TStack_28,"list1.GetHead()->next == 0");
  }
  return;
}

Assistant:

TEST (TestsAreAddedToTheListThroughMacro)
{
    CHECK(list1.GetHead() != 0);
    CHECK(list1.GetHead()->next == 0);
}